

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O2

void wr_stores(void)

{
  object *obj;
  _Bool _Var1;
  uint8_t v;
  store *store;
  object **ppoVar2;
  long lVar3;
  
  wr_u16b(z_info->store_max);
  for (lVar3 = 0; lVar3 < world->num_towns; lVar3 = lVar3 + 1) {
    store = (store *)&world->towns[lVar3].stores;
    while (store = store->next, store != (store *)0x0) {
      _Var1 = store_is_home(store);
      v = 0xff;
      if (!_Var1) {
        v = (uint8_t)store->owner->oidx;
      }
      wr_byte(v);
      wr_byte(store->stock_num);
      ppoVar2 = &store->stock;
      while (obj = *ppoVar2, obj != (object *)0x0) {
        wr_item(obj->known);
        wr_item(obj);
        ppoVar2 = &obj->next;
      }
    }
  }
  return;
}

Assistant:

void wr_stores(void)
{
	int i;

	wr_u16b(z_info->store_max);
	for (i = 0; i < world->num_towns; i++) {
		struct town *town = &world->towns[i];
		struct store *store = town->stores;
		while (store) {
			struct object *obj;

			/* Save the current owner */
			if (store_is_home(store))
				wr_byte(-1);
			else
				wr_byte(store->owner->oidx);

			/* Save the stock size */
			wr_byte(store->stock_num);

			/* Save the stock */
			for (obj = store->stock; obj; obj = obj->next) {
				wr_item(obj->known);
				wr_item(obj);
			}
			store = store->next;
		}
	}
}